

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

void __thiscall
cs::stack_type<cs_impl::any,std::allocator>::push<cs::pointer_const&>
          (stack_type<cs_impl::any,std::allocator> *this,pointer *args)

{
  any *this_00;
  error *this_01;
  allocator local_31;
  string local_30;
  
  this_00 = *(any **)(this + 8);
  if ((long)this_00 - *(long *)this >> 3 != *(long *)(this + 0x20)) {
    *(any **)(this + 8) = this_00 + 1;
    cs_impl::any::any<cs::pointer>(this_00,args);
    return;
  }
  this_01 = (error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_30,"E000I",&local_31);
  cov::error::error(this_01,&local_30);
  __cxa_throw(this_01,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

inline void push(ArgsT &&...args)
		{
			if (full())
				throw cov::error("E000I");
			::new(m_current++) T(std::forward<ArgsT>(args)...);
		}